

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,string_view name,int *value)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  EnumEntry *pEVar2;
  EnumEntry *it;
  EnumEntry target;
  int *value_local;
  size_t size_local;
  EnumEntry *enums_local;
  string_view name_local;
  
  target._16_8_ = name._M_str;
  target.name._M_str._0_4_ = 0;
  it = (EnumEntry *)size;
  target.name._M_len = name._M_len;
  pEVar2 = std::
           lower_bound<google::protobuf::internal::EnumEntry_const*,google::protobuf::internal::EnumEntry,bool(*)(google::protobuf::internal::EnumEntry_const&,google::protobuf::internal::EnumEntry_const&)>
                     ((EnumEntry *)this,(EnumEntry *)(this + (long)enums * 0x18),(EnumEntry *)&it,
                      anon_unknown_3::EnumCompareByName);
  if ((pEVar2 == (EnumEntry *)(this + (long)enums * 0x18)) ||
     (__x._M_len = (pEVar2->name)._M_len, __x._M_str = (pEVar2->name)._M_str,
     __y._M_str = (char *)name._M_len, __y._M_len = size, bVar1 = std::operator==(__x,__y), !bVar1))
  {
    name_local._M_str._7_1_ = false;
  }
  else {
    *(int *)target._16_8_ = pEVar2->value;
    name_local._M_str._7_1_ = true;
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     absl::string_view name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}